

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_183::InfoCollector::visitArrayCopy(InfoCollector *this,ArrayCopy *curr)

{
  bool bVar1;
  Module *wasm;
  ArrayGet *curr_00;
  ArraySet *curr_01;
  ArraySet *set;
  ArrayGet *get;
  Builder builder;
  ArrayCopy *curr_local;
  InfoCollector *this_local;
  
  builder.wasm._4_4_ = 1;
  bVar1 = wasm::Type::operator==
                    (&(curr->super_SpecificExpression<(wasm::Expression::Id)77>).super_Expression.
                      type,(BasicType *)((long)&builder.wasm + 4));
  if (!bVar1) {
    wasm = Walker<wasm::(anonymous_namespace)::InfoCollector,_wasm::OverriddenVisitor<wasm::(anonymous_namespace)::InfoCollector,_void>_>
           ::getModule((Walker<wasm::(anonymous_namespace)::InfoCollector,_wasm::OverriddenVisitor<wasm::(anonymous_namespace)::InfoCollector,_void>_>
                        *)this);
    Builder::Builder((Builder *)&get,wasm);
    curr_00 = Builder::makeArrayGet
                        ((Builder *)&get,curr->srcRef,curr->srcIndex,(Type)(curr->srcRef->type).id,
                         false);
    visitArrayGet(this,curr_00);
    curr_01 = Builder::makeArraySet
                        ((Builder *)&get,curr->destRef,curr->destIndex,(Expression *)curr_00);
    visitArraySet(this,curr_01);
  }
  return;
}

Assistant:

void visitArrayCopy(ArrayCopy* curr) {
    if (curr->type == Type::unreachable) {
      return;
    }
    // Our flow handling of GC data is not simple: we have special code for each
    // read and write instruction. Therefore, to avoid adding special code for
    // ArrayCopy, model it as a combination of an ArrayRead and ArrayWrite, by
    // just emitting fake expressions for those. The fake expressions are not
    // part of the main IR, which is potentially confusing during debugging,
    // however, which is a downside.
    Builder builder(*getModule());
    auto* get =
      builder.makeArrayGet(curr->srcRef, curr->srcIndex, curr->srcRef->type);
    visitArrayGet(get);
    auto* set = builder.makeArraySet(curr->destRef, curr->destIndex, get);
    visitArraySet(set);
  }